

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1d85b2b::av1_inv_txfm1d_InvAccuracyCheck_Test::
~av1_inv_txfm1d_InvAccuracyCheck_Test(av1_inv_txfm1d_InvAccuracyCheck_Test *this)

{
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST(av1_inv_txfm1d, InvAccuracyCheck) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  const int count_test_block = 20000;
  const int max_error[] = { 6, 10, 19, 31, 40 };
  ASSERT_EQ(NELEMENTS(max_error), TX_SIZES);
  ASSERT_EQ(NELEMENTS(inv_txfm_func_ls), TX_SIZES);
  for (int i = 0; i < count_test_block; ++i) {
    // choose a random transform to test
    const TxSize tx_size = static_cast<TxSize>(rnd.Rand8() % TX_SIZES);
    const int txfm_size = txfm_size_ls[tx_size];
    const TxfmFunc inv_txfm_func = inv_txfm_func_ls[tx_size][0];

    int32_t input[64];
    random_matrix(input, txfm_size, &rnd);

    // 64x64 transform assumes last 32 values are zero.
    memset(input + 32, 0, 32 * sizeof(input[0]));

    int32_t ref_output[64];
    memset(ref_output, 0, sizeof(ref_output));
    reference_idct_1d_int(input, ref_output, txfm_size);

    int32_t output[64];
    memset(output, 0, sizeof(output));
    inv_txfm_func(input, output, cos_bit, range_bit);

    for (int ni = 0; ni < txfm_size; ++ni) {
      EXPECT_LE(abs(output[ni] - ref_output[ni]), max_error[tx_size])
          << "tx_size = " << tx_size << ", ni = " << ni
          << ", output[ni] = " << output[ni]
          << ", ref_output[ni] = " << ref_output[ni];
    }
  }
}